

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

Normalizer2 * icu_63::Normalizer2::getNFKCCasefoldInstance(UErrorCode *errorCode)

{
  Normalizer2 *pNVar1;
  long lVar2;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    umtx_initOnce<char_const*>((UInitOnce *)&nfkc_cfInitOnce,initSingletons,"nfkc_cf",errorCode);
    lVar2 = nfkc_cfSingleton;
  }
  else {
    lVar2 = 0;
  }
  pNVar1 = (Normalizer2 *)(lVar2 + 8);
  if (lVar2 == 0) {
    pNVar1 = (Normalizer2 *)0x0;
  }
  return pNVar1;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }